

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

unsigned_long
NonAdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,
                  PaUtilChannelDescriptor *hostInputChannels,
                  PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  void **ppvVar1;
  void ***pppvVar2;
  long *plVar3;
  PaStreamCallbackTimeInfo *pPVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  PaUtilChannelDescriptor *pPVar9;
  PaUtilChannelDescriptor *pPVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  void **ppvVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  void *pvVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  double dVar22;
  void **local_80;
  PaUtilChannelDescriptor *local_78;
  unsigned_long local_70;
  
  if (*streamCallbackResult == 0) {
    ppvVar1 = &bp->tempOutputBuffer;
    pppvVar2 = &bp->tempOutputBufferPtrs;
    local_70 = 0;
    bVar6 = false;
    bVar5 = false;
    do {
      uVar14 = bp->framesPerTempBuffer;
      if (framesToProcess <= bp->framesPerTempBuffer) {
        uVar14 = framesToProcess;
      }
      uVar11 = bp->inputChannelCount;
      uVar8 = (ulong)uVar11;
      uVar18 = (uint)uVar14;
      if (uVar8 == 0) {
        local_80 = (void **)0x0;
      }
      else {
        ppvVar15 = (void **)bp->tempInputBuffer;
        uVar12 = bp->bytesPerUserInputSample;
        if (bp->userInputIsInterleaved == 0) {
          if (((bp->userInputSampleFormatIsEqualToHost == 0) || (bp->hostInputIsInterleaved != 0))
             || (bp->hostInputChannels[0]->data == (void *)0x0)) {
            uVar11 = 0;
            for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
              bp->tempInputBufferPtrs[uVar17] =
                   (void *)(uVar11 * uVar14 + (long)bp->tempInputBuffer);
              uVar11 = uVar11 + uVar12;
            }
          }
          else {
            for (lVar13 = 0; uVar8 * 8 - lVar13 != 0; lVar13 = lVar13 + 8) {
              *(undefined8 *)((long)bp->tempInputBufferPtrs + lVar13) =
                   *(undefined8 *)((long)&hostInputChannels->data + lVar13 * 2);
            }
            bVar5 = true;
          }
          uVar12 = uVar12 * uVar18;
          uVar11 = 1;
          local_80 = bp->tempInputBufferPtrs;
        }
        else {
          local_80 = ppvVar15;
          if (((bp->userInputSampleFormatIsEqualToHost != 0) && (bp->hostInputIsInterleaved != 0))
             && (bp->hostInputChannels[0]->data != (void *)0x0)) {
            ppvVar15 = (void **)hostInputChannels->data;
            bVar5 = true;
            local_80 = ppvVar15;
          }
        }
        if (bp->hostInputChannels[0]->data == (void *)0x0) {
          for (uVar16 = 0; uVar16 < (uint)uVar8; uVar16 = uVar16 + 1) {
            (*bp->inputZeroer)(ppvVar15,uVar11,uVar18);
            ppvVar15 = (void **)((long)ppvVar15 + (ulong)uVar12);
            uVar8 = (ulong)bp->inputChannelCount;
          }
        }
        else if (bVar5) {
          uVar11 = bp->bytesPerHostInputSample;
          for (lVar13 = 0; uVar8 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
            plVar3 = (long *)((long)&hostInputChannels->data + lVar13);
            *plVar3 = *plVar3 + (ulong)*(uint *)((long)&hostInputChannels->stride + lVar13) *
                                uVar11 * uVar14;
          }
          bVar5 = true;
        }
        else {
          pPVar9 = hostInputChannels;
          for (uVar17 = 0; uVar17 < uVar8; uVar17 = uVar17 + 1) {
            (*bp->inputConverter)
                      (ppvVar15,uVar11,pPVar9->data,pPVar9->stride,uVar18,&bp->ditherGenerator);
            pPVar9->data = (void *)((long)pPVar9->data +
                                   (ulong)bp->bytesPerHostInputSample * pPVar9->stride * uVar14);
            ppvVar15 = (void **)((long)ppvVar15 + (ulong)uVar12);
            uVar8 = (ulong)bp->inputChannelCount;
            pPVar9 = pPVar9 + 1;
          }
          bVar5 = false;
        }
      }
      uVar8 = (ulong)bp->outputChannelCount;
      if (uVar8 == 0) {
        pvVar19 = (void *)0x0;
      }
      else {
        if (bp->userOutputIsInterleaved == 0) {
          if ((bp->userOutputSampleFormatIsEqualToHost == 0) || (bp->hostOutputIsInterleaved != 0))
          {
            uVar11 = bp->bytesPerUserOutputSample;
            uVar12 = 0;
            for (uVar17 = 0; pPVar9 = (PaUtilChannelDescriptor *)pppvVar2, uVar8 != uVar17;
                uVar17 = uVar17 + 1) {
              (*pppvVar2)[uVar17] = (void *)(uVar12 * uVar14 + (long)*ppvVar1);
              uVar12 = uVar12 + uVar11;
            }
            goto LAB_00106d30;
          }
          for (lVar13 = 0; uVar8 << 3 != lVar13; lVar13 = lVar13 + 8) {
            *(undefined8 *)((long)*pppvVar2 + lVar13) =
                 *(undefined8 *)((long)&hostOutputChannels->data + lVar13 * 2);
          }
          pPVar10 = (PaUtilChannelDescriptor *)pppvVar2;
          bVar20 = true;
        }
        else {
          pPVar9 = (PaUtilChannelDescriptor *)ppvVar1;
          if ((bp->userOutputSampleFormatIsEqualToHost == 0) ||
             (pPVar10 = hostOutputChannels, bVar20 = true, bp->hostOutputIsInterleaved == 0)) {
LAB_00106d30:
            pPVar10 = pPVar9;
            bVar20 = bVar6;
          }
        }
        bVar6 = bVar20;
        pvVar19 = pPVar10->data;
      }
      iVar7 = (*bp->streamCallback)
                        (local_80,pvVar19,uVar14,bp->timeInfo,bp->callbackStatusFlags,bp->userData);
      *streamCallbackResult = iVar7;
      if (iVar7 != 2) {
        auVar21._8_4_ = (int)(uVar14 >> 0x20);
        auVar21._0_8_ = uVar14;
        auVar21._12_4_ = 0x45300000;
        pPVar4 = bp->timeInfo;
        dVar22 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar18) - 4503599627370496.0)) * bp->samplePeriod;
        pPVar4->inputBufferAdcTime = pPVar4->inputBufferAdcTime + dVar22;
        pPVar4->outputBufferDacTime = dVar22 + pPVar4->outputBufferDacTime;
        uVar11 = bp->outputChannelCount;
        uVar8 = (ulong)uVar11;
        if ((uVar8 != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) {
          if (bVar6) {
            uVar11 = bp->bytesPerHostOutputSample;
            for (lVar13 = 0; uVar8 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
              plVar3 = (long *)((long)&hostOutputChannels->data + lVar13);
              *plVar3 = *plVar3 + (ulong)*(uint *)((long)&hostOutputChannels->stride + lVar13) *
                                  uVar11 * uVar14;
            }
          }
          else {
            bVar20 = bp->userOutputIsInterleaved == 0;
            if (bVar20) {
              uVar11 = 1;
            }
            pvVar19 = bp->tempOutputBuffer;
            uVar12 = 1;
            if (bVar20) {
              uVar12 = uVar18;
            }
            uVar16 = bp->bytesPerUserOutputSample;
            pPVar9 = hostOutputChannels;
            for (uVar17 = 0; uVar17 < uVar8; uVar17 = uVar17 + 1) {
              (*bp->outputConverter)
                        (pPVar9->data,pPVar9->stride,pvVar19,uVar11,uVar18,&bp->ditherGenerator);
              pPVar9->data = (void *)((long)pPVar9->data +
                                     (ulong)bp->bytesPerHostOutputSample * pPVar9->stride * uVar14);
              pvVar19 = (void *)((long)pvVar19 + (ulong)(uVar12 * uVar16));
              uVar8 = (ulong)bp->outputChannelCount;
              pPVar9 = pPVar9 + 1;
            }
          }
        }
        local_70 = local_70 + uVar14;
        framesToProcess = framesToProcess - uVar14;
      }
      if (framesToProcess == 0) {
        return local_70;
      }
    } while (*streamCallbackResult == 0);
  }
  else {
    local_70 = 0;
    if (framesToProcess == 0) {
      return 0;
    }
  }
  uVar11 = bp->outputChannelCount;
  if ((uVar11 != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) {
    local_78 = hostOutputChannels;
    for (uVar14 = 0; uVar14 < uVar11; uVar14 = uVar14 + 1) {
      (*bp->outputZeroer)(local_78->data,local_78->stride,(uint)framesToProcess);
      local_78->data =
           (void *)((long)local_78->data +
                   (ulong)bp->bytesPerHostOutputSample * local_78->stride * framesToProcess);
      uVar11 = bp->outputChannelCount;
      local_78 = local_78 + 1;
    }
  }
  return local_70 + framesToProcess;
}

Assistant:

static unsigned long NonAdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr, *destBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;
    int skipOutputConvert = 0;
    int skipInputConvert = 0;


    if( *streamCallbackResult == paContinue )
    {
        do
        {
            frameCount = PA_MIN_( bp->framesPerTempBuffer, framesToGo );

            /* configure user input buffer and convert input data (host -> user) */
            if( bp->inputChannelCount == 0 )
            {
                /* no input */
                userInput = 0;
            }
            else /* there are input channels */
            {
                
                destBytePtr = (unsigned char *)bp->tempInputBuffer;

                if( bp->userInputIsInterleaved )
                {
                    destSampleStrideSamples = bp->inputChannelCount;
                    destChannelStrideBytes = bp->bytesPerUserInputSample;

                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved */
                    if( bp->userInputSampleFormatIsEqualToHost && bp->hostInputIsInterleaved && bp->hostInputChannels[0][0].data)
                    {
                        userInput = hostInputChannels[0].data;
                        destBytePtr = (unsigned char *)hostInputChannels[0].data;
                        skipInputConvert = 1;
                    }
                    else
                    {
                        userInput = bp->tempInputBuffer;
                    }
                }
                else /* user input is not interleaved */
                {
                    destSampleStrideSamples = 1;
                    destChannelStrideBytes = frameCount * bp->bytesPerUserInputSample;

                    /* setup non-interleaved ptrs */
                    if( bp->userInputSampleFormatIsEqualToHost && !bp->hostInputIsInterleaved && bp->hostInputChannels[0][0].data )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = hostInputChannels[i].data;
                        }
                        skipInputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                                i * bp->bytesPerUserInputSample * frameCount;
                        }
                    }
                
                    userInput = bp->tempInputBufferPtrs;
                }

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput), so
                        zero the input buffer */

                    for( i=0; i<bp->inputChannelCount; ++i )
                    {
                        bp->inputZeroer( destBytePtr, destSampleStrideSamples, frameCount );
                        destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */
                    }
                }
                else
	            {
                    if( skipInputConvert )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                                    hostInputChannels[i].data,
                                                    hostInputChannels[i].stride,
                                                    frameCount, &bp->ditherGenerator );

                            destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                }
            }

            /* configure user output buffer */
            if( bp->outputChannelCount == 0 )
            {
                /* no output */
                userOutput = 0;
            }
            else /* there are output channels */
            {
                if( bp->userOutputIsInterleaved )
                {
                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved */
                    if( bp->userOutputSampleFormatIsEqualToHost && bp->hostOutputIsInterleaved )
                    {
                        userOutput = hostOutputChannels[0].data;
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        userOutput = bp->tempOutputBuffer;
                    }
                }
                else /* user output is not interleaved */
                {
                    if( bp->userOutputSampleFormatIsEqualToHost && !bp->hostOutputIsInterleaved )
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = hostOutputChannels[i].data;
                        }
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                                i * bp->bytesPerUserOutputSample * frameCount;
                        }
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }
            }
        
            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    frameCount, bp->timeInfo, bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* callback returned paAbort, don't advance framesProcessed
                        and framesToGo, they will be handled below */
            }
            else
            {
                bp->timeInfo->inputBufferAdcTime += frameCount * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += frameCount * bp->samplePeriod;

                /* convert output data (user -> host) */
                
                if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
                {
                    if( skipOutputConvert )
					{
						for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                            	    frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
					else
					{

                    	srcBytePtr = (unsigned char *)bp->tempOutputBuffer;

                    	if( bp->userOutputIsInterleaved )
                    	{
                        	srcSampleStrideSamples = bp->outputChannelCount;
                        	srcChannelStrideBytes = bp->bytesPerUserOutputSample;
                    	}
                    	else /* user output is not interleaved */
                    	{
                        	srcSampleStrideSamples = 1;
                        	srcChannelStrideBytes = frameCount * bp->bytesPerUserOutputSample;
                    	}

                    	for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	bp->outputConverter(    hostOutputChannels[i].data,
                                                	hostOutputChannels[i].stride,
                                                	srcBytePtr, srcSampleStrideSamples,
                                                	frameCount, &bp->ditherGenerator );

                        	srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                                		frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
                }
             
                framesProcessed += frameCount;

                framesToGo -= frameCount;
            }
        }
        while( framesToGo > 0  && *streamCallbackResult == paContinue );
    }

    if( framesToGo > 0 )
    {
        /* zero any remaining frames output. There will only be remaining frames
            if the callback has returned paComplete or paAbort */

        frameCount = framesToGo;

        if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
        {
            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }

        framesProcessed += frameCount;
    }

    return framesProcessed;
}